

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

uint8_vec * __thiscall crnlib::ktx_texture::find_key(ktx_texture *this,char *pKey)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint i;
  ulong uVar4;
  uint8_vec *puVar5;
  
  sVar3 = strlen(pKey);
  uVar1 = (this->m_key_values).m_size;
  puVar5 = (this->m_key_values).m_p;
  uVar4 = 0;
  while( true ) {
    if (uVar1 <= uVar4) {
      return (uint8_vec *)0x0;
    }
    if ((sVar3 + 1 <= (ulong)puVar5->m_size) &&
       (iVar2 = bcmp(puVar5->m_p,pKey,sVar3 + 1), iVar2 == 0)) break;
    uVar4 = uVar4 + 1;
    puVar5 = puVar5 + 1;
  }
  return puVar5;
}

Assistant:

const uint8_vec* ktx_texture::find_key(const char* pKey) const
    {
        const size_t n = strlen(pKey) + 1;
        for (uint i = 0; i < m_key_values.size(); i++)
        {
            const uint8_vec& v = m_key_values[i];
            if ((v.size() >= n) && (!memcmp(&v[0], pKey, n)))
            {
                return &v;
            }
        }

        return nullptr;
    }